

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<chatra::Node> __thiscall
chatra::parseAsLiteral(chatra *this,ParserContext *ct,Token *token)

{
  double dVar1;
  bool bVar2;
  Literal *this_00;
  long lVar3;
  pointer pLVar4;
  uint64_t uVar5;
  AbortCompilingException *this_01;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chatra::Node> sVar7;
  Token *local_118;
  undefined1 local_109;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_> local_30;
  unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_> value;
  string *t;
  Token *token_local;
  ParserContext *ct_local;
  shared_ptr<chatra::Node> *n;
  
  value._M_t.super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>._M_t.
  super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>.
  super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl =
       (__uniq_ptr_data<chatra::Literal,_std::default_delete<chatra::Literal>,_true,_true>)
       &token->literal;
  this_00 = (Literal *)operator_new(0x30);
  memset(this_00,0,0x30);
  Literal::Literal(this_00);
  std::unique_ptr<chatra::Literal,std::default_delete<chatra::Literal>>::
  unique_ptr<std::default_delete<chatra::Literal>,void>
            ((unique_ptr<chatra::Literal,std::default_delete<chatra::Literal>> *)&local_30,this_00);
  if (token->type == Number) {
    bVar2 = startsWith((string *)
                       value._M_t.
                       super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                       .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"0x");
    if (bVar2) {
      pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                         (&local_30);
      pLVar4->type = Int;
      uVar5 = parseIntLiteral(ct,token,(string *)
                                       value._M_t.
                                       super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                                       .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl
                              ,2,"hexadecimal",0x10);
      pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                         (&local_30);
      (pLVar4->field_1).vInt = uVar5;
    }
    else {
      bVar2 = startsWith((string *)
                         value._M_t.
                         super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                         .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"0b");
      if (bVar2) {
        pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                           (&local_30);
        pLVar4->type = Int;
        uVar5 = parseIntLiteral(ct,token,(string *)
                                         value._M_t.
                                         super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                                         .super__Head_base<0UL,_chatra::Literal_*,_false>.
                                         _M_head_impl,2,"binary",2);
        pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                           (&local_30);
        (pLVar4->field_1).vInt = uVar5;
      }
      else {
        lVar3 = std::__cxx11::string::find
                          ((char)value._M_t.
                                 super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                                 .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0x2e)
        ;
        if (lVar3 == -1) {
          pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::
                   operator->(&local_30);
          pLVar4->type = Int;
          uVar5 = parseIntLiteral(ct,token,(string *)
                                           value._M_t.
                                           super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                                           .super__Head_base<0UL,_chatra::Literal_*,_false>.
                                           _M_head_impl,0,"decimal",10);
          pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::
                   operator->(&local_30);
          (pLVar4->field_1).vInt = uVar5;
        }
        else {
          pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::
                   operator->(&local_30);
          pLVar4->type = Float;
          dVar1 = parseFloatLiteral(ct,token,(string *)
                                             value._M_t.
                                             super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                                             .super__Head_base<0UL,_chatra::Literal_*,_false>.
                                             _M_head_impl,0);
          pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::
                   operator->(&local_30);
          (pLVar4->field_1).vFloat = dVar1;
        }
      }
    }
  }
  else if (token->type == Name) {
    if (token->sid == Null) {
      pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                         (&local_30);
      pLVar4->type = Null;
    }
    else {
      pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                         (&local_30);
      pLVar4->type = Bool;
      bVar2 = parseBooleanLiteral(ct,token,token->sid);
      pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                         (&local_30);
      (pLVar4->field_1).vBool = bVar2;
    }
  }
  else {
    if (token->type != String) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"internal error",&local_e1);
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_108);
      ParserContext::errorAtToken(ct,Error,token,&local_e0,&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      this_01 = (AbortCompilingException *)__cxa_allocate_exception(8);
      *this_01 = (AbortCompilingException)0x0;
      AbortCompilingException::AbortCompilingException(this_01);
      __cxa_throw(this_01,&AbortCompilingException::typeinfo,
                  AbortCompilingException::~AbortCompilingException);
    }
    pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                       (&local_30);
    pLVar4->type = String;
    bVar2 = startsWith((string *)
                       value._M_t.
                       super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                       .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"\'");
    if ((bVar2) ||
       (bVar2 = startsWith((string *)
                           value._M_t.
                           super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                           .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"\""),
       bVar2)) {
      parseStringLiteral(&local_60,ct,token,
                         (string *)
                         value._M_t.
                         super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                         .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0);
      pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                         (&local_30);
      std::__cxx11::string::operator=((string *)&pLVar4->vString,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      bVar2 = startsWith((string *)
                         value._M_t.
                         super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                         .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"L\'");
      if ((bVar2) ||
         (bVar2 = startsWith((string *)
                             value._M_t.
                             super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                             .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"L\""),
         bVar2)) {
        pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                           (&local_30);
        pLVar4->type = MultilingualString;
        parseStringLiteral(&local_80,ct,token,
                           (string *)
                           value._M_t.
                           super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                           .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,1);
        pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator->
                           (&local_30);
        std::__cxx11::string::operator=((string *)&pLVar4->vString,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
      else {
        bVar2 = startsWith((string *)
                           value._M_t.
                           super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                           .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"r\'");
        if ((bVar2) ||
           (bVar2 = startsWith((string *)
                               value._M_t.
                               super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                               .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,"r\""
                              ), bVar2)) {
          parseRegexpStringLiteral
                    (&local_a0,
                     (string *)
                     value._M_t.
                     super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                     .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,1);
          pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::
                   operator->(&local_30);
          std::__cxx11::string::operator=((string *)&pLVar4->vString,(string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
        }
        else {
          bVar2 = startsWith((string *)
                             value._M_t.
                             super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                             .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,0,
                             "R<<<\n");
          if (bVar2) {
            parseRawStringLiteral
                      (&local_c0,ct,token,
                       (string *)
                       value._M_t.
                       super___uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chatra::Literal_*,_std::default_delete<chatra::Literal>_>
                       .super__Head_base<0UL,_chatra::Literal_*,_false>._M_head_impl,5);
            pLVar4 = std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::
                     operator->(&local_30);
            std::__cxx11::string::operator=((string *)&pLVar4->vString,(string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
      }
    }
  }
  local_109 = 0;
  std::make_shared<chatra::Node>();
  peVar6 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  peVar6->type = Literal;
  peVar6 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_118 = token;
  std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::push_back
            (&peVar6->tokens,&local_118);
  peVar6 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::operator=
            (&peVar6->literalValue,&local_30);
  local_109 = 1;
  std::unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_>::~unique_ptr(&local_30);
  sVar7.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar7.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseAsLiteral(ParserContext& ct, const Token& token) {
	auto& t = token.literal;

	std::unique_ptr<Literal> value(new Literal());

	if (token.type == TokenType::Number) {
		if (startsWith(t, 0, "0x")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "hexadecimal", 16);
		}
		else if (startsWith(t, 0, "0b")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "binary", 2);
		}
		else if (t.find('.') != std::string::npos) {
			value->type = LiteralType::Float;
			value->vFloat = parseFloatLiteral(ct, token, t, 0);
		}
		else {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 0, "decimal", 10);
		}
	}
	else if (token.type == TokenType::Name) {
		if (token.sid == StringId::Null)
			value->type = LiteralType::Null;
		else {
			value->type = LiteralType::Bool;
			value->vBool = parseBooleanLiteral(ct, token, token.sid);
		}
	}
	else if (token.type == TokenType::String) {
		value->type = LiteralType::String;
		if (startsWith(t, 0, "'") || startsWith(t, 0, "\""))
			 value->vString = parseStringLiteral(ct, token, t, 0);
		else if (startsWith(t, 0, "L'") || startsWith(t, 0, "L\"")) {
			value->type = LiteralType ::MultilingualString;
			value->vString = parseStringLiteral(ct, token, t, 1);
		}
		else if (startsWith(t, 0, "r'") || startsWith(t, 0, "r\""))
			value->vString = parseRegexpStringLiteral(t, 1);
		else if (startsWith(t, 0, "R<<<\n"))
			value->vString = parseRawStringLiteral(ct, token, t, 5);
	}
	else {
		ct.errorAtToken(ErrorLevel::Error, token, "internal error", {});
		throw AbortCompilingException();
	}

	std::shared_ptr<Node> n = std::make_shared<Node>();
	n->type = NodeType::Literal;
	n->tokens.push_back(&token);
	n->literalValue = std::move(value);
	return n;
}